

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
::ConvertToStruct(vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
                  *__return_storage_ptr__,
                 JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
                 *this)

{
  bool bVar1;
  undefined1 local_b8 [8];
  ElementsDestroyAmountStruct data;
  ElementsDestroyAmount *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
  *this_local;
  vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
                    super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
                  );
  element = (ElementsDestroyAmount *)
            std::
            vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
                   super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::ElementsDestroyAmount_*,_std::vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::ElementsDestroyAmount_*,_std::vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>_>
                 ::operator*(&__end0);
    js::api::json::ElementsDestroyAmount::ConvertToStruct
              ((ElementsDestroyAmountStruct *)local_b8,
               (ElementsDestroyAmount *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_b8);
    js::api::ElementsDestroyAmountStruct::~ElementsDestroyAmountStruct
              ((ElementsDestroyAmountStruct *)local_b8);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::ElementsDestroyAmount_*,_std::vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }